

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogl_shader.c
# Opt level: O0

_Bool glsl_use_shader(ALLEGRO_SHADER *shader,ALLEGRO_DISPLAY *display,
                     _Bool set_projview_matrix_from_display)

{
  byte bVar1;
  _Bool _Var2;
  GLenum e;
  char *pcVar3;
  byte in_DL;
  long in_RSI;
  long in_RDI;
  GLenum err;
  GLuint program_object;
  ALLEGRO_SHADER_GLSL_S *gl_shader;
  undefined7 in_stack_00000018;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  GLuint GVar4;
  undefined7 in_stack_ffffffffffffffe0;
  _Bool local_1;
  
  bVar1 = in_DL & 1;
  if ((*(uint *)(in_RSI + 0x8c) & 4) == 0) {
    local_1 = false;
  }
  else {
    GVar4 = *(GLuint *)(in_RDI + 0x58);
    glGetError();
    (*_al_glUseProgram)(GVar4);
    e = glGetError();
    if (e == 0) {
      *(GLuint *)(*(long *)(in_RSI + 0x160) + 0x210) = GVar4;
      memcpy((void *)(*(long *)(in_RSI + 0x160) + 0x214),(void *)(in_RDI + 0x5c),0x54);
      if ((bVar1 & 1) != 0) {
        _al_glsl_set_projview_matrix
                  (e,(ALLEGRO_TRANSFORM *)
                     CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      }
      _al_ogl_update_render_state((ALLEGRO_DISPLAY *)CONCAT17(bVar1,in_stack_ffffffffffffffe0));
      local_1 = true;
    }
    else {
      _Var2 = _al_trace_prefix((char *)shader,display._4_4_,
                               (char *)CONCAT17(set_projview_matrix_from_display,in_stack_00000018),
                               gl_shader._4_4_,_err);
      if (_Var2) {
        pcVar3 = _al_gl_error_string(e);
        _al_trace_suffix("glUseProgram(%u) failed: %s\n",(ulong)GVar4,pcVar3);
      }
      *(undefined4 *)(*(long *)(in_RSI + 0x160) + 0x210) = 0;
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

static bool glsl_use_shader(ALLEGRO_SHADER *shader, ALLEGRO_DISPLAY *display,
   bool set_projview_matrix_from_display)
{
   ALLEGRO_SHADER_GLSL_S *gl_shader;
   GLuint program_object;
   GLenum err;

   if (!(display->flags & ALLEGRO_OPENGL)) {
      return false;
   }

   gl_shader = (ALLEGRO_SHADER_GLSL_S *)shader;
   program_object = gl_shader->program_object;

   glGetError(); /* clear error */
   glUseProgram(program_object);
   err = glGetError();
   if (err != GL_NO_ERROR) {
      ALLEGRO_WARN("glUseProgram(%u) failed: %s\n", program_object,
         _al_gl_error_string(err));
      display->ogl_extras->program_object = 0;
      return false;
   }

   display->ogl_extras->program_object = program_object;

   /* Copy variable locations. */
   display->ogl_extras->varlocs = gl_shader->varlocs;

   /* Optionally set projview matrix.  We skip this when it is known that the
    * matrices in the display are out of date and are about to be clobbered
    * itself.
    */
   if (set_projview_matrix_from_display) {
      _al_glsl_set_projview_matrix(
         display->ogl_extras->varlocs.projview_matrix_loc, &display->projview_transform);
   }

   /* Alpha testing may be done in the shader and so when a shader is
    * set the uniforms need to be synchronized.
    */
   _al_ogl_update_render_state(display);

   return true;
}